

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cshutdn.c
# Opt level: O3

uint Curl_cshutdn_add_waitfds(cshutdn *cshutdn,Curl_easy *data,Curl_waitfds *cwfds)

{
  uint uVar1;
  Curl_llist_node *pCVar2;
  connectdata *conn;
  uint uVar3;
  easy_pollset ps;
  easy_pollset local_58;
  
  pCVar2 = Curl_llist_head(&cshutdn->list);
  if ((pCVar2 == (Curl_llist_node *)0x0) ||
     (pCVar2 = Curl_llist_head(&cshutdn->list), pCVar2 == (Curl_llist_node *)0x0)) {
    uVar3 = 0;
  }
  else {
    uVar3 = 0;
    do {
      conn = (connectdata *)Curl_node_elem(pCVar2);
      local_58.sockets[0] = 0;
      local_58.sockets[1] = 0;
      local_58.sockets[2] = 0;
      local_58.sockets[3] = 0;
      local_58.sockets[4] = 0;
      local_58.num = 0;
      local_58.actions[0] = '\0';
      local_58.actions[1] = '\0';
      local_58.actions[2] = '\0';
      local_58.actions[3] = '\0';
      local_58.actions[4] = '\0';
      local_58._29_3_ = 0;
      Curl_attach_connection(data,conn);
      Curl_conn_adjust_pollset(data,conn,&local_58);
      Curl_detach_connection(data);
      uVar1 = Curl_waitfds_add_ps(cwfds,&local_58);
      uVar3 = uVar3 + uVar1;
      pCVar2 = Curl_node_next(pCVar2);
    } while (pCVar2 != (Curl_llist_node *)0x0);
  }
  return uVar3;
}

Assistant:

unsigned int Curl_cshutdn_add_waitfds(struct cshutdn *cshutdn,
                                      struct Curl_easy *data,
                                      struct Curl_waitfds *cwfds)
{
  unsigned int need = 0;

  if(Curl_llist_head(&cshutdn->list)) {
    struct Curl_llist_node *e;
    struct easy_pollset ps;
    struct connectdata *conn;

    for(e = Curl_llist_head(&cshutdn->list); e;
        e = Curl_node_next(e)) {
      conn = Curl_node_elem(e);
      memset(&ps, 0, sizeof(ps));
      Curl_attach_connection(data, conn);
      Curl_conn_adjust_pollset(data, conn, &ps);
      Curl_detach_connection(data);

      need += Curl_waitfds_add_ps(cwfds, &ps);
    }
  }
  return need;
}